

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void google::protobuf::anon_unknown_1::InitAllowedProto3Extendee(void)

{
  char *__rhs;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var1;
  long lVar2;
  _func_void *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_ =
       (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        *)operator_new(0x30);
  *(undefined4 *)((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_ + 8) = 0;
  *(undefined8 *)((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_ + 0x10) = 0;
  *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    **)((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_ + 0x18) =
       (anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_ + 8;
  *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    **)((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_ + 0x20) =
       (anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_ + 8;
  *(undefined8 *)((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_ + 0x28) = 0;
  for (lVar2 = 0; p_Var1 = (anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_,
      lVar2 != 0x40; lVar2 = lVar2 + 8) {
    std::__cxx11::string::string((string *)&local_90,"google.protobuf.",(allocator *)&local_50);
    __rhs = *(char **)((long)&DAT_00771a70 + lVar2);
    std::operator+(&local_70,&local_90,__rhs);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>(p_Var1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    p_Var1 = (anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_;
    std::__cxx11::string::string((string *)&local_50,"proto",(allocator *)&stack0xffffffffffffff6f);
    std::operator+(&local_90,&local_50,"2.");
    std::operator+(&local_70,&local_90,__rhs);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>(p_Var1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  internal::OnShutdown(in_stack_ffffffffffffff68);
  return;
}

Assistant:

void InitAllowedProto3Extendee() {
  allowed_proto3_extendees_ = new std::set<string>;
  const char* kOptionNames[] = {
      "FileOptions",      "MessageOptions", "FieldOptions", "EnumOptions",
      "EnumValueOptions", "ServiceOptions", "MethodOptions", "OneofOptions"};
  for (int i = 0; i < GOOGLE_ARRAYSIZE(kOptionNames); ++i) {
    // descriptor.proto has a different package name in opensource. We allow
    // both so the opensource protocol compiler can also compile internal
    // proto3 files with custom options. See: b/27567912
    allowed_proto3_extendees_->insert(string("google.protobuf.") +
                                      kOptionNames[i]);
    // Split the word to trick the opensource processing scripts so they
    // will keep the origial package name.
    allowed_proto3_extendees_->insert(string("proto") + "2." + kOptionNames[i]);
  }

  google::protobuf::internal::OnShutdown(&DeleteAllowedProto3Extendee);
}